

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

void __thiscall
bloaty::RangeSink::AddFileRangeForVMAddr
          (RangeSink *this,char *analyzer,uint64_t label_from_vmaddr,string_view file_range)

{
  pointer ppVar1;
  bool verbose;
  bool bVar2;
  char *pcVar3;
  uint64_t filesize;
  pointer ppVar4;
  uint64_t fileoff;
  string_view format;
  DualMap *a2;
  string label;
  Arg local_e0;
  string local_b0;
  Arg local_90;
  Arg local_60;
  
  filesize = file_range._M_len;
  fileoff = (long)file_range._M_str - (long)(this->file_->data_)._M_str;
  verbose = IsVerboseForFileRange(this,fileoff,filesize);
  if (verbose) {
    pcVar3 = GetDataSourceLabel(this->data_source_);
    printf("[%s, %s] AddFileRangeForVMAddr(%lx, [%lx, %zx])\n",pcVar3,analyzer,label_from_vmaddr,
           fileoff,filesize);
  }
  if (this->translator_ != (DualMap *)0x0) {
    ppVar1 = (this->outputs_).
             super__Vector_base<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar4 = (this->outputs_).
                  super__Vector_base<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppVar4 != ppVar1; ppVar4 = ppVar4 + 1)
    {
      label._M_dataplus._M_p = (pointer)&label.field_2;
      label._M_string_length = 0;
      label.field_2._M_local_buf[0] = '\0';
      bVar2 = RangeMap::TryGetLabel(&ppVar4->first->vm_map,label_from_vmaddr,&label);
      if (bVar2) {
        a2 = ppVar4->first;
        bVar2 = RangeMap::AddRangeWithTranslation
                          (&a2->file_map,fileoff,filesize,&label,&this->translator_->file_map,
                           verbose,&a2->vm_map);
        if (!bVar2 && 0 < verbose_level) {
          absl::substitute_internal::Arg::Arg(&local_90,fileoff);
          absl::substitute_internal::Arg::Arg(&local_60,filesize);
          local_e0.piece_._M_len = label._M_string_length;
          local_e0.piece_._M_str = label._M_dataplus._M_p;
          format._M_str = (char *)&local_90;
          format._M_len = (size_t)"File range ($0, $1) for label $2 extends beyond base map";
          absl::Substitute_abi_cxx11_(&local_b0,(absl *)0x38,format,&local_60,&local_e0,(Arg *)a2);
          printf("WARNING: %s\n",local_b0._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&local_b0);
        }
      }
      else if (1 < verbose_level) {
        printf("No label found for vmaddr %lx\n",label_from_vmaddr);
      }
      std::__cxx11::string::~string((string *)&label);
    }
    return;
  }
  __assert_fail("translator_",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/bloaty.cc",
                0x4b7,
                "void bloaty::RangeSink::AddFileRangeForVMAddr(const char *, uint64_t, string_view)"
               );
}

Assistant:

void RangeSink::AddFileRangeForVMAddr(const char* analyzer,
                                      uint64_t label_from_vmaddr,
                                      string_view file_range) {
  uint64_t file_offset = file_range.data() - file_->data().data();
  bool verbose = IsVerboseForFileRange(file_offset, file_range.size());
  if (verbose) {
    printf("[%s, %s] AddFileRangeForVMAddr(%" PRIx64 ", [%" PRIx64 ", %zx])\n",
           GetDataSourceLabel(data_source_), analyzer, label_from_vmaddr,
           file_offset, file_range.size());
  }
  assert(translator_);
  for (auto& pair : outputs_) {
    std::string label;
    if (pair.first->vm_map.TryGetLabel(label_from_vmaddr, &label)) {
      bool ok = pair.first->file_map.AddRangeWithTranslation(
          file_offset, file_range.size(), label, translator_->file_map, verbose,
          &pair.first->vm_map);
      if (!ok) {
        WARN("File range ($0, $1) for label $2 extends beyond base map",
             file_offset, file_range.size(), label);
      }
    } else if (verbose_level > 1) {
      printf("No label found for vmaddr %" PRIx64 "\n", label_from_vmaddr);
    }
  }
}